

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O0

BigInteger * __thiscall rapidjson::internal::BigInteger::MultiplyPow5(BigInteger *this,uint exp)

{
  uint local_1c;
  uint exp_local;
  BigInteger *this_local;
  
  local_1c = exp;
  if (exp != 0) {
    for (; 0x1a < local_1c; local_1c = local_1c - 0x1b) {
      operator*=(this,0x6765c793fa10079d);
    }
    for (; 0xc < local_1c; local_1c = local_1c - 0xd) {
      operator*=(this,0x48c27395);
    }
    if (local_1c != 0) {
      operator*=(this,MultiplyPow5::kPow5[local_1c - 1]);
    }
  }
  return this;
}

Assistant:

BigInteger& MultiplyPow5(unsigned exp) {
        static const uint32_t kPow5[12] = {
            5,
            5 * 5,
            5 * 5 * 5,
            5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5,
            5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5 * 5
        };
        if (exp == 0) return *this;
        for (; exp >= 27; exp -= 27) *this *= RAPIDJSON_UINT64_C2(0X6765C793, 0XFA10079D); // 5^27
        for (; exp >= 13; exp -= 13) *this *= static_cast<uint32_t>(1220703125u); // 5^13
        if (exp > 0)                 *this *= kPow5[exp - 1];
        return *this;
    }